

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_byte(bitstream *str)

{
  int iVar1;
  void *pvVar2;
  int *in_RDI;
  
  if (*in_RDI == 0) {
    switch(in_RDI[0xb]) {
    case 0:
    case 2:
      break;
    case 1:
      if ((*(byte *)(in_RDI + 6) < 2) && (1 < in_RDI[9])) {
        fprintf(_stderr,"00 00 0%d emitted!\n",(ulong)*(byte *)(in_RDI + 6));
        return 1;
      }
      break;
    case 3:
      if ((*(byte *)(in_RDI + 6) < 4) && (in_RDI[9] == 2)) {
        if (in_RDI[5] <= in_RDI[4]) {
          if (in_RDI[5] == 0) {
            in_RDI[5] = 0x10;
          }
          else {
            in_RDI[5] = in_RDI[5] << 1;
          }
          pvVar2 = realloc(*(void **)(in_RDI + 2),(long)in_RDI[5]);
          *(void **)(in_RDI + 2) = pvVar2;
        }
        iVar1 = in_RDI[4];
        in_RDI[4] = iVar1 + 1;
        *(undefined1 *)(*(long *)(in_RDI + 2) + (long)iVar1) = 3;
        in_RDI[9] = 0;
      }
      break;
    default:
      abort();
    }
    if (in_RDI[5] <= in_RDI[4]) {
      if (in_RDI[5] == 0) {
        in_RDI[5] = 0x10;
      }
      else {
        in_RDI[5] = in_RDI[5] << 1;
      }
      pvVar2 = realloc(*(void **)(in_RDI + 2),(long)in_RDI[5]);
      *(void **)(in_RDI + 2) = pvVar2;
    }
    iVar1 = in_RDI[4];
    in_RDI[4] = iVar1 + 1;
    *(char *)(*(long *)(in_RDI + 2) + (long)iVar1) = (char)in_RDI[6];
    if ((char)in_RDI[6] == '\0') {
      in_RDI[9] = in_RDI[9] + 1;
    }
    else {
      in_RDI[9] = 0;
    }
    *(undefined1 *)(in_RDI + 6) = 0;
  }
  else {
    if (in_RDI[4] <= in_RDI[8]) {
      fprintf(_stderr,"End of bitstream in a NAL!\n");
      return 1;
    }
    iVar1 = in_RDI[8];
    in_RDI[8] = iVar1 + 1;
    *(undefined1 *)(in_RDI + 6) = *(undefined1 *)(*(long *)(in_RDI + 2) + (long)iVar1);
    switch(in_RDI[0xb]) {
    case 0:
    case 2:
      break;
    case 1:
      if ((*(byte *)(in_RDI + 6) < 2) && (1 < in_RDI[9])) {
        fprintf(_stderr,"00 00 0%d read in a NAL!\n",(ulong)*(byte *)(in_RDI + 6));
        return 1;
      }
      break;
    case 3:
      if (in_RDI[9] == 2) {
        if (*(byte *)(in_RDI + 6) < 3) {
          fprintf(_stderr,"00 00 0%d read in a NAL!\n",(ulong)*(byte *)(in_RDI + 6));
          return 1;
        }
        if (*(byte *)(in_RDI + 6) == 3) {
          if (in_RDI[4] <= in_RDI[8]) {
            fprintf(_stderr,"End of bitstream in a NAL!\n");
            return 1;
          }
          in_RDI[9] = 0;
          iVar1 = in_RDI[8];
          in_RDI[8] = iVar1 + 1;
          *(undefined1 *)(in_RDI + 6) = *(undefined1 *)(*(long *)(in_RDI + 2) + (long)iVar1);
          if (3 < *(byte *)(in_RDI + 6)) {
            fprintf(_stderr,"Invalid escape sequence: 00 00 03 %02x!\n",(ulong)*(byte *)(in_RDI + 6)
                   );
            return 1;
          }
        }
      }
      break;
    default:
      abort();
    }
    if ((char)in_RDI[6] == '\0') {
      in_RDI[9] = in_RDI[9] + 1;
    }
    else {
      in_RDI[9] = 0;
    }
    in_RDI[0xc] = 1;
  }
  in_RDI[7] = 7;
  return 0;
}

Assistant:

int vs_byte(struct bitstream *str) {
	if (str->dir == VS_ENCODE) {
		switch (str->type) {
			case VS_H262:
				if (str->curbyte < 2 && str->zero_bytes >= 2) {
					fprintf(stderr, "00 00 0%d emitted!\n", str->curbyte);
					return 1;
				}
				break;
			case VS_H264:
				if (str->curbyte < 4 && str->zero_bytes == 2) {
					/* escape */
					ADDARRAY(str->bytes, 3);
					str->zero_bytes = 0;
				}
				break;
			case VS_H261:
			case VS_H263:
				/* start codes not byte-oriented in these */
				break;
			default:
				abort();
		}
		ADDARRAY(str->bytes, str->curbyte);
		if (!str->curbyte)
			str->zero_bytes++;
		else
			str->zero_bytes = 0;
		str->curbyte = 0;
	} else {
		if (str->bytepos >= str->bytesnum) {
			fprintf(stderr, "End of bitstream in a NAL!\n");
			return 1;
		}
		str->curbyte = str->bytes[str->bytepos++];
		switch (str->type) {
			case VS_H262:
				if (str->curbyte < 2 && str->zero_bytes >= 2) {
					fprintf(stderr, "00 00 0%d read in a NAL!\n", str->curbyte);
					return 1;
				}
				break;
			case VS_H264:
				if (str->zero_bytes == 2) {
					switch (str->curbyte) {
						case 0:
						case 1:
						case 2:
							fprintf(stderr, "00 00 0%d read in a NAL!\n", str->curbyte);
							return 1;
						case 3:
							if (str->bytepos >= str->bytesnum) {
								fprintf(stderr, "End of bitstream in a NAL!\n");
								return 1;
							}
							str->zero_bytes = 0;
							str->curbyte = str->bytes[str->bytepos++];
							if (str->curbyte > 3) {
								fprintf(stderr, "Invalid escape sequence: 00 00 03 %02x!\n", str->curbyte);
								return 1;
							}
							break;
					}
				}
				break;
			case VS_H261:
			case VS_H263:
				/* start codes not byte-oriented in these */
				break;
			default:
				abort();
		}
		if (!str->curbyte)
			str->zero_bytes++;
		else
			str->zero_bytes = 0;
		str->hasbyte = 1;
	}
	str->bitpos = 7;
	return 0;
}